

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall google::protobuf::internal::ExtensionSet::Extension::IsInitialized(Extension *this)

{
  Arena *pAVar1;
  char cVar2;
  void *pvVar3;
  long lVar4;
  
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4) == 10) {
    if (this->is_repeated == true) {
      lVar4 = 0;
      do {
        if ((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).current_size_ <=
            lVar4) {
          return true;
        }
        cVar2 = (**(code **)(*((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase)
                              .rep_)->elements[lVar4] + 0x40))();
        lVar4 = lVar4 + 1;
      } while (cVar2 != '\0');
      return false;
    }
    if ((this->field_0xa & 1) == 0) {
      pAVar1 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        cVar2 = (*(code *)(pAVar1->impl_).options_.initial_block_size)();
      }
      else {
        pvVar3 = (*(pAVar1->impl_).options_.block_alloc)
                           ((size_t)(this->field_0).repeated_string_value);
        cVar2 = (char)pvVar3;
      }
      if (cVar2 == '\0') {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::Extension::IsInitialized() const {
  if (cpp_type(type) == WireFormatLite::CPPTYPE_MESSAGE) {
    if (is_repeated) {
      for (int i = 0; i < repeated_message_value->size(); i++) {
        if (!repeated_message_value->Get(i).IsInitialized()) {
          return false;
        }
      }
    } else {
      if (!is_cleared) {
        if (is_lazy) {
          if (!lazymessage_value->IsInitialized()) return false;
        } else {
          if (!message_value->IsInitialized()) return false;
        }
      }
    }
  }
  return true;
}